

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset.cpp
# Opt level: O1

void InitPresetArray(void)

{
  RookCannonCanGet *pRVar1;
  RookCannonMask *pRVar2;
  bool bVar3;
  uint uVar4;
  byte bVar5;
  UINT8 UVar6;
  ushort uVar7;
  int iVar9;
  int (*paaiVar10) [2] [10];
  byte bVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  UINT16 *pUVar15;
  int iVar16;
  int (*paaiVar17) [2] [10];
  int i_2;
  UINT16 UVar18;
  int (*paaiVar19) [2] [10];
  uint uVar20;
  uint uVar21;
  int (*paaiVar22) [2] [10];
  long lVar23;
  int i_1;
  uint uVar24;
  int (*paaiVar25) [2] [10];
  int i;
  ulong uVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  int j_1;
  long lVar30;
  int iVar31;
  ulong uVar32;
  int j;
  UINT8 local_3d;
  int local_3c;
  uint uVar8;
  
  memset(HORSE_CAN_GET,0,0x2800);
  paaiVar10 = PAWN_CAN_GET;
  paaiVar17 = ADVISOR_CAN_GET;
  paaiVar19 = BISHOP_EYE;
  paaiVar22 = KING_CAN_GET;
  paaiVar25 = BISHOP_CAN_GET;
  uVar32 = 0;
  do {
    lVar14 = 0;
    do {
      *(undefined4 *)((long)(*paaiVar25)[0] + lVar14) = 0;
      *(undefined4 *)((long)(*paaiVar25)[1] + lVar14) = 0;
      *(undefined4 *)((long)(*paaiVar22)[0] + lVar14) = 0;
      *(undefined4 *)((long)(*paaiVar22)[1] + lVar14) = 0;
      *(undefined4 *)((long)(*paaiVar19)[0] + lVar14) = 0;
      *(undefined4 *)((long)(*paaiVar19)[1] + lVar14) = 0;
      *(undefined4 *)((long)(*paaiVar17)[0] + lVar14) = 0;
      *(undefined4 *)((long)(*paaiVar17)[1] + lVar14) = 0;
      *(undefined4 *)((long)(*paaiVar10)[0] + lVar14) = 0;
      *(undefined4 *)((long)(*paaiVar10)[1] + lVar14) = 0;
      lVar14 = lVar14 + 4;
    } while (lVar14 != 0x28);
    if (""[uVar32] == '\0') {
      UVar18 = 0;
      pUVar15 = BIT_ROW_MASK;
    }
    else {
      BIT_ROW_MASK[uVar32] = (UINT16)(1 << (0xb - ((byte)uVar32 & 0xf) & 0x1f));
      UVar18 = (UINT16)(1 << (0xcU - (char)(uVar32 >> 4) & 0x1f));
      pUVar15 = BIT_COL_MASK;
    }
    pUVar15[uVar32] = UVar18;
    uVar32 = uVar32 + 1;
    paaiVar10 = paaiVar10 + 1;
    paaiVar17 = paaiVar17 + 1;
    paaiVar19 = paaiVar19 + 1;
    paaiVar22 = paaiVar22 + 1;
    paaiVar25 = paaiVar25 + 1;
  } while (uVar32 != 0x100);
  uVar24 = 0x33;
  do {
    lVar14 = (long)(int)uVar24;
    bVar5 = LEGAL_POSITION[0][lVar14];
    if ((bVar5 & 2) != 0) {
      lVar23 = 0;
      iVar31 = 0;
      do {
        lVar30 = *(int *)((long)KING_DIRECTION + lVar23) + lVar14;
        if ((LEGAL_POSITION[0][lVar30] & 2) != 0) {
          KING_CAN_GET[lVar14][0][iVar31] = (int)lVar30;
          iVar31 = iVar31 + 1;
        }
        lVar23 = lVar23 + 4;
      } while (lVar23 != 0x10);
    }
    bVar11 = LEGAL_POSITION[1][lVar14];
    if ((bVar11 & 2) != 0) {
      lVar23 = 0;
      iVar31 = 0;
      do {
        lVar30 = *(int *)((long)KING_DIRECTION + lVar23) + lVar14;
        if ((LEGAL_POSITION[1][lVar30] & 2) != 0) {
          *(int *)(lVar14 * 0x50 + 0x2efd78 + (long)iVar31 * 4) = (int)lVar30;
          iVar31 = iVar31 + 1;
        }
        lVar23 = lVar23 + 4;
      } while (lVar23 != 0x10);
    }
    if ((bVar5 & 4) != 0) {
      lVar23 = 0;
      iVar31 = 0;
      do {
        lVar30 = *(int *)((long)ADVISOR_DIRECTION + lVar23) + lVar14;
        if ((LEGAL_POSITION[0][lVar30] & 4) != 0) {
          ADVISOR_CAN_GET[lVar14][0][iVar31] = (int)lVar30;
          iVar31 = iVar31 + 1;
        }
        lVar23 = lVar23 + 4;
      } while (lVar23 != 0x10);
    }
    if ((bVar11 & 4) != 0) {
      lVar23 = 0;
      iVar31 = 0;
      do {
        lVar30 = *(int *)((long)ADVISOR_DIRECTION + lVar23) + lVar14;
        if ((LEGAL_POSITION[1][lVar30] & 4) != 0) {
          *(int *)(lVar14 * 0x50 + 0x2f4d78 + (long)iVar31 * 4) = (int)lVar30;
          iVar31 = iVar31 + 1;
        }
        lVar23 = lVar23 + 4;
      } while (lVar23 != 0x10);
    }
    if ((bVar5 & 0x10) != 0) {
      lVar23 = 0;
      iVar31 = 0;
      do {
        lVar30 = *(int *)((long)BISHOP_DIRECTION + lVar23) + lVar14;
        if ((LEGAL_POSITION[0][lVar30] & 0x10) != 0) {
          BISHOP_CAN_GET[lVar14][0][iVar31] = (int)lVar30;
          BISHOP_EYE[lVar14][0][iVar31] = *(int *)((long)BISHOP_EYE_DIRECTION + lVar23) + uVar24;
          iVar31 = iVar31 + 1;
        }
        lVar23 = lVar23 + 4;
      } while (lVar23 != 0x10);
    }
    if ((bVar11 & 0x10) != 0) {
      lVar23 = 0;
      iVar31 = 0;
      do {
        lVar30 = *(int *)((long)BISHOP_DIRECTION + lVar23) + lVar14;
        if ((LEGAL_POSITION[1][lVar30] & 0x10) != 0) {
          *(int *)(lVar14 * 0x50 + 0x2fed78 + (long)iVar31 * 4) = (int)lVar30;
          *(uint *)(lVar14 * 0x50 + 0x303d78 + (long)iVar31 * 4) =
               *(int *)((long)BISHOP_EYE_DIRECTION + lVar23) + uVar24;
          iVar31 = iVar31 + 1;
        }
        lVar23 = lVar23 + 4;
      } while (lVar23 != 0x10);
    }
    if ((bVar5 & 1) != 0) {
      lVar23 = 0;
      iVar31 = 0;
      do {
        lVar30 = *(int *)((long)HORSE_DIRECTION + lVar23) + lVar14;
        if ((LEGAL_POSITION[0][lVar30] & 1) != 0) {
          HORSE_CAN_GET[lVar14][iVar31] = (int)lVar30;
          HORSE_LEG[lVar14][iVar31] = *(int *)((long)HORSE_LEG_DIRECTION + lVar23) + uVar24;
          iVar31 = iVar31 + 1;
        }
        lVar23 = lVar23 + 4;
      } while (lVar23 != 0x20);
    }
    if ((bVar5 & 8) != 0) {
      lVar23 = 0;
      iVar31 = 0;
      do {
        lVar30 = *(int *)((long)PAWN_DIRECTION[0] + lVar23) + lVar14;
        if ((LEGAL_POSITION[0][lVar30] & 8) != 0) {
          PAWN_CAN_GET[lVar14][0][iVar31] = (int)lVar30;
          iVar31 = iVar31 + 1;
        }
        lVar23 = lVar23 + 4;
      } while (lVar23 != 0xc);
    }
    if ((bVar11 & 8) != 0) {
      lVar23 = 0;
      iVar31 = 0;
      do {
        lVar30 = PAWN_DIRECTION[1][lVar23] + lVar14;
        if ((LEGAL_POSITION[1][lVar30] & 8) != 0) {
          *(int *)(lVar14 * 0x50 + 0x2f9d78 + (long)iVar31 * 4) = (int)lVar30;
          iVar31 = iVar31 + 1;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 3);
    }
    uVar20 = uVar24 & 0xf;
    uVar21 = uVar24 + 8;
    if (uVar24 == 0xcb) {
      uVar21 = 0;
    }
    uVar24 = uVar24 + 1;
    if (uVar20 == 0xb) {
      uVar24 = uVar21;
    }
  } while (uVar24 != 0);
  uVar24 = 7;
  local_3c = 1;
  uVar21 = 9;
  uVar32 = 0;
  do {
    uVar20 = (uint)uVar32;
    lVar14 = 0;
    do {
      pRVar1 = ROOK_CANNON_CAN_GET_ROW[uVar32] + lVar14;
      pRVar2 = ROOK_CANNON_CAN_GET_ROW_MASK[uVar32] + lVar14;
      *pRVar1 = (RookCannonCanGet)((ulong)(uVar20 + 3 & 0xff) * 0x101010101010101);
      pRVar2->no_capture = 0;
      pRVar2->rook_capture = 0;
      pRVar2->cannon_capture = 0;
      pRVar2->supercannon_capture = 0;
      uVar29 = (uint)lVar14;
      uVar13 = uVar20;
      if (uVar32 < 8) {
        uVar26 = uVar32 & 0xffffffff;
        uVar12 = uVar24;
        do {
          uVar13 = (uint)uVar26;
          uVar7 = (ushort)(1 << ((byte)uVar12 & 0x1f));
          if ((uVar29 >> (uVar12 & 0x1f) & 1) != 0) {
            pRVar1->rook_capture[0] = (char)uVar26 + '\x04';
            pRVar2->rook_capture = uVar7;
            goto LAB_00107c1f;
          }
          pRVar2->no_capture = pRVar2->no_capture | uVar7;
          pRVar1->no_capture[0] = (char)uVar26 + '\x04';
          uVar12 = uVar12 - 1;
          uVar26 = (ulong)(uVar13 + 1);
        } while (uVar13 + 1 != 8);
        uVar13 = 8;
      }
LAB_00107c1f:
      uVar12 = uVar13 + 2;
      if (uVar13 < 7) {
        iVar31 = 0;
        do {
          uVar8 = (6 - uVar13) + iVar31;
          if ((uVar29 >> (uVar8 & 0x1f) & 1) != 0) {
            pRVar1->cannon_capture[0] = ((char)uVar13 + '\x05') - (char)iVar31;
            pRVar2->cannon_capture = (UINT16)(1 << ((byte)uVar8 & 0x1f));
            uVar12 = uVar12 - iVar31;
            goto LAB_00107c6c;
          }
          iVar31 = iVar31 + -1;
        } while (uVar13 - 7 != iVar31);
        uVar12 = 9;
      }
LAB_00107c6c:
      uVar13 = 8;
      if (8 < uVar12) {
        uVar13 = uVar12;
      }
      uVar8 = uVar12 + 3;
      uVar12 = 7 - uVar12;
      do {
        if (uVar13 + uVar12 == 7) goto LAB_00107ca8;
        bVar11 = (byte)uVar12;
        bVar5 = (char)uVar8 + 1;
        uVar8 = (uint)bVar5;
        uVar4 = uVar12 & 0x1f;
        uVar12 = uVar12 - 1;
      } while ((uVar29 >> uVar4 & 1) == 0);
      pRVar1->supercannon_capture[0] = bVar5;
      pRVar2->supercannon_capture = (UINT16)(1 << (bVar11 & 0x1f));
LAB_00107ca8:
      iVar31 = local_3c;
      uVar13 = uVar21;
      uVar12 = uVar20;
      if (uVar32 != 0) {
        do {
          uVar7 = (ushort)(1 << ((byte)uVar13 & 0x1f));
          if ((uVar29 >> (uVar13 & 0x1f) & 1) != 0) {
            pRVar1->rook_capture[1] = (char)iVar31 + '\x01';
            pRVar2->rook_capture = pRVar2->rook_capture | uVar7;
            uVar12 = iVar31 - 1;
            goto LAB_00107ced;
          }
          pRVar2->no_capture = pRVar2->no_capture | uVar7;
          pRVar1->no_capture[1] = (char)iVar31 + '\x01';
          iVar31 = iVar31 + -1;
          uVar13 = uVar13 + 1;
        } while (1 < iVar31);
        uVar12 = 0;
      }
LAB_00107ced:
      iVar31 = uVar12 - 2;
      if (1 < (int)uVar12) {
        iVar27 = 0;
        iVar28 = uVar12 - 1;
        do {
          uVar13 = (10 - uVar12) + iVar27;
          if ((uVar29 >> (uVar13 & 0x1f) & 1) != 0) {
            pRVar1->cannon_capture[1] = ((char)uVar12 - (char)iVar27) + '\x01';
            pRVar2->cannon_capture = pRVar2->cannon_capture | (ushort)(1 << ((byte)uVar13 & 0x1f));
            iVar31 = iVar31 - iVar27;
            goto LAB_00107d36;
          }
          iVar27 = iVar27 + 1;
          iVar9 = iVar28 + -1;
          bVar3 = 0 < iVar28;
          iVar28 = iVar9;
        } while (iVar9 != 0 && bVar3);
        iVar31 = -1;
      }
LAB_00107d36:
      uVar13 = 9 - iVar31;
      do {
        if (iVar31 < 1) goto LAB_00107d64;
        bVar5 = (byte)uVar13;
        iVar31 = iVar31 + -1;
        uVar12 = uVar13 & 0x1f;
        uVar13 = uVar13 + 1;
      } while ((uVar29 >> uVar12 & 1) == 0);
      pRVar1->supercannon_capture[1] = (char)iVar31 + '\x03';
      pRVar2->supercannon_capture = pRVar2->supercannon_capture | (ushort)(1 << (bVar5 & 0x1f));
LAB_00107d64:
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x200);
    uVar32 = uVar32 + 1;
    uVar24 = uVar24 - 1;
    local_3c = local_3c + 1;
    uVar21 = uVar21 - 1;
  } while (uVar32 != 9);
  local_3d = '\x04';
  iVar31 = 0;
  local_3c = 1;
  uVar24 = 10;
  uVar32 = 0;
  do {
    uVar21 = (uint)uVar32;
    lVar14 = 0;
    do {
      pRVar1 = ROOK_CANNON_CAN_GET_COL[uVar32] + lVar14;
      pRVar2 = ROOK_CANNON_CAN_GET_COL_MASK[uVar32] + lVar14;
      *pRVar1 = (RookCannonCanGet)((ulong)(uVar21 + 3 & 0xff) * 0x101010101010101);
      pRVar2->no_capture = 0;
      pRVar2->rook_capture = 0;
      pRVar2->cannon_capture = 0;
      pRVar2->supercannon_capture = 0;
      uVar13 = (uint)lVar14;
      uVar20 = uVar21;
      UVar6 = local_3d;
      iVar28 = iVar31;
      if (uVar32 < 9) {
        do {
          uVar7 = (ushort)(1 << ((byte)(iVar28 + 8U) & 0x1f));
          if ((uVar13 >> (iVar28 + 8U & 0x1f) & 1) != 0) {
            pRVar1->rook_capture[0] = UVar6;
            pRVar2->rook_capture = uVar7;
            uVar20 = -iVar28;
            goto LAB_00107e3d;
          }
          pRVar2->no_capture = pRVar2->no_capture | uVar7;
          pRVar1->no_capture[0] = UVar6;
          iVar28 = iVar28 + -1;
          UVar6 = UVar6 + '\x01';
        } while (iVar28 != -9);
        uVar20 = 9;
      }
LAB_00107e3d:
      uVar29 = uVar20 + 2;
      if (uVar20 < 8) {
        iVar28 = 0;
        do {
          uVar12 = (7 - uVar20) + iVar28;
          if ((uVar13 >> (uVar12 & 0x1f) & 1) != 0) {
            pRVar1->cannon_capture[0] = ((char)uVar20 + '\x05') - (char)iVar28;
            pRVar2->cannon_capture = (UINT16)(1 << ((byte)uVar12 & 0x1f));
            uVar29 = uVar29 - iVar28;
            goto LAB_00107e88;
          }
          iVar28 = iVar28 + -1;
        } while (uVar20 - 8 != iVar28);
        uVar29 = 10;
      }
LAB_00107e88:
      uVar20 = 9;
      if (9 < uVar29) {
        uVar20 = uVar29;
      }
      uVar12 = uVar29 + 3;
      uVar29 = 8 - uVar29;
      do {
        if (uVar20 + uVar29 == 8) goto LAB_00107ec5;
        bVar11 = (byte)uVar29;
        bVar5 = (char)uVar12 + 1;
        uVar12 = (uint)bVar5;
        uVar8 = uVar29 & 0x1f;
        uVar29 = uVar29 - 1;
      } while ((uVar13 >> uVar8 & 1) == 0);
      pRVar1->supercannon_capture[0] = bVar5;
      pRVar2->supercannon_capture = (UINT16)(1 << (bVar11 & 0x1f));
LAB_00107ec5:
      iVar28 = local_3c;
      uVar20 = uVar24;
      uVar29 = uVar21;
      if (uVar32 != 0) {
        do {
          uVar7 = (ushort)(1 << ((byte)uVar20 & 0x1f));
          if ((uVar13 >> (uVar20 & 0x1f) & 1) != 0) {
            pRVar1->rook_capture[1] = (char)iVar28 + '\x01';
            pRVar2->rook_capture = pRVar2->rook_capture | uVar7;
            uVar29 = iVar28 - 1;
            goto LAB_00107f0f;
          }
          pRVar2->no_capture = pRVar2->no_capture | uVar7;
          pRVar1->no_capture[1] = (char)iVar28 + '\x01';
          iVar28 = iVar28 + -1;
          uVar20 = uVar20 + 1;
        } while (1 < iVar28);
        uVar29 = 0;
      }
LAB_00107f0f:
      iVar28 = uVar29 - 2;
      if (1 < (int)uVar29) {
        iVar9 = 0;
        iVar27 = uVar29 - 1;
        do {
          uVar20 = (0xb - uVar29) + iVar9;
          if ((uVar13 >> (uVar20 & 0x1f) & 1) != 0) {
            pRVar1->cannon_capture[1] = ((char)uVar29 - (char)iVar9) + '\x01';
            pRVar2->cannon_capture = pRVar2->cannon_capture | (ushort)(1 << ((byte)uVar20 & 0x1f));
            iVar28 = iVar28 - iVar9;
            goto LAB_00107f57;
          }
          iVar9 = iVar9 + 1;
          iVar16 = iVar27 + -1;
          bVar3 = 0 < iVar27;
          iVar27 = iVar16;
        } while (iVar16 != 0 && bVar3);
        iVar28 = -1;
      }
LAB_00107f57:
      uVar20 = 10 - iVar28;
      do {
        if (iVar28 < 1) goto LAB_00107f84;
        bVar5 = (byte)uVar20;
        iVar28 = iVar28 + -1;
        uVar29 = uVar20 & 0x1f;
        uVar20 = uVar20 + 1;
      } while ((uVar13 >> uVar29 & 1) == 0);
      pRVar1->supercannon_capture[1] = (char)iVar28 + '\x03';
      pRVar2->supercannon_capture = pRVar2->supercannon_capture | (ushort)(1 << (bVar5 & 0x1f));
LAB_00107f84:
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x400);
    uVar32 = uVar32 + 1;
    local_3d = local_3d + '\x01';
    iVar31 = iVar31 + -1;
    local_3c = local_3c + 1;
    uVar24 = uVar24 - 1;
    if (uVar32 == 10) {
      return;
    }
  } while( true );
}

Assistant:

void InitPresetArray(){
    // 1. 初始化预置数组
    for(int i = 0; i < 256; i ++){
        // 1.1. 初始化其他预置数组
        for(int j = 0; j < 10; j ++){
            HORSE_CAN_GET[i][j] = 0;
            HORSE_CAN_GET[i][j] = 0;
            BISHOP_CAN_GET[i][0][j] = 0;
            BISHOP_CAN_GET[i][1][j] = 0;
            KING_CAN_GET[i][0][j] = 0;
            KING_CAN_GET[i][1][j] = 0;
            BISHOP_EYE[i][0][j] = 0;
            BISHOP_EYE[i][1][j] = 0;
            ADVISOR_CAN_GET[i][0][j] = 0;
            ADVISOR_CAN_GET[i][1][j] = 0;
            PAWN_CAN_GET[i][0][j] = 0;
            PAWN_CAN_GET[i][1][j] = 0;
        }

        // 1.2. 初始化位行位列屏蔽位
        if(ON_BOARD[i]){
            BIT_ROW_MASK[i] = 1 << RowBitOpration(GetCol(i) - 3);
            BIT_COL_MASK[i] = 1 << ColBitOpration(GetRow(i) - 3);
        }
        else{
            BIT_ROW_MASK[i] = 0;
            BIT_ROW_MASK[i] = 0;
        }
    }
    int position = BOARD_FIRST_POSITION;    // 初始位置为棋盘上的第一个位置

    // 2.循环棋盘上的每一个位置
    //   (备注： POSITION_MASK[7] = {2, 4, 16, 1, 1, 1, 8} 各子力的特征值 将士相车马炮卒)
    while(position != 0){
        int num_of_can_get = 0;             // 预生成着法的个数
        int next_position;                  // 着后的下一个位置

        // 2.1. 生成帅（红）的在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[0]){
            for(int i = 0; i < 4; i ++){
                next_position = position + KING_DIRECTION[i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[0]){
                    KING_CAN_GET[position][RED][num_of_can_get] = next_position;
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.2. 生成将（黑）在该位置的可行走法
        if(LEGAL_POSITION[BLACK][position] & POSITION_MASK[0]){
            for(int i = 0; i < 4; i ++){
                next_position = position + KING_DIRECTION[i];
                if(LEGAL_POSITION[BLACK][next_position] & POSITION_MASK[0]){
                    KING_CAN_GET[position][BLACK][num_of_can_get] = next_position;
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        
        // 2.3. 生成仕(红)在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[1]){
            for(int i = 0; i < 4; i ++){
                next_position = position + ADVISOR_DIRECTION[i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[1]){
                    ADVISOR_CAN_GET[position][RED][num_of_can_get] = next_position;
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.3. 生成士(黑)在该位置的可行走法
        if(LEGAL_POSITION[BLACK][position] & POSITION_MASK[1]){
            for(int i = 0; i < 4; i ++){
                next_position = position + ADVISOR_DIRECTION[i];
                if(LEGAL_POSITION[BLACK][next_position] & POSITION_MASK[1]){
                    ADVISOR_CAN_GET[position][BLACK][num_of_can_get] = next_position;
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.4. 生成象(红)在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[2]){
            for(int i = 0; i < 4; i ++){
                next_position = position + BISHOP_DIRECTION[i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[2]){
                    BISHOP_CAN_GET[position][RED][num_of_can_get] = next_position;
                    BISHOP_EYE[position][RED][num_of_can_get] = position + BISHOP_EYE_DIRECTION[i];
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.5. 生成象(黑)在该位置的可行走法
        if(LEGAL_POSITION[BLACK][position] & POSITION_MASK[2]){
            for(int i = 0; i < 4; i ++){
                next_position = position + BISHOP_DIRECTION[i];
                if(LEGAL_POSITION[BLACK][next_position] & POSITION_MASK[2]){
                    BISHOP_CAN_GET[position][BLACK][num_of_can_get] = next_position;
                    BISHOP_EYE[position][BLACK][num_of_can_get] = position + BISHOP_EYE_DIRECTION[i];
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.6. 生成马在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[4]){
            for(int i = 0; i < 8; i ++){
                next_position = position + HORSE_DIRECTION[i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[4]){
                    HORSE_CAN_GET[position][num_of_can_get] = next_position;
                    HORSE_LEG[position][num_of_can_get] = position + HORSE_LEG_DIRECTION[i];
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.7. 生成兵(红)在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[6]){
            for(int i = 0; i < 3; i ++){
                next_position = position + PAWN_DIRECTION[RED][i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[6]){
                    PAWN_CAN_GET[position][RED][num_of_can_get] = next_position; 
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.8. 生成兵(黑)在该位置的可行走法
        if(LEGAL_POSITION[BLACK][position] & POSITION_MASK[6]){
            for(int i = 0; i < 3; i ++){
                next_position = position + PAWN_DIRECTION[BLACK][i];
                if(LEGAL_POSITION[BLACK][next_position] & POSITION_MASK[6]){
                    PAWN_CAN_GET[position][BLACK][num_of_can_get] = next_position; 
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        position = NextBoardPosition(position);
    }

    // 3.生成位行位列预置数组
    
    // 3.1. 循环一行中的每一列
    for(int i = 0; i < 9; i ++){
        // 循环一行中的每种状态(位置是否有棋子)
        for(int j = 0; j < (1 << 9); j ++){
            // 3.1.1 将着法初始化(用当前位置初始化)
            ROOK_CANNON_CAN_GET_ROW[i][j].cannon_capture[0] = ROOK_CANNON_CAN_GET_ROW[i][j].cannon_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_ROW[i][j].no_capture[0] = ROOK_CANNON_CAN_GET_ROW[i][j].no_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_ROW[i][j].rook_capture[0] = ROOK_CANNON_CAN_GET_ROW[i][j].rook_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_ROW[i][j].supercannon_capture[0] = ROOK_CANNON_CAN_GET_ROW[i][j].supercannon_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_ROW_MASK[i][j].cannon_capture = ROOK_CANNON_CAN_GET_ROW_MASK[i][j].supercannon_capture = ROOK_CANNON_CAN_GET_ROW_MASK[i][j].no_capture = ROOK_CANNON_CAN_GET_ROW_MASK[i][j].rook_capture = 0;
            int col;
            // 3.1.2 生成车炮右边的着法
            for(col = i + 1; col < 9; col ++){
                // 此状态下，该列没有棋子
                if((j & (1 << RowBitOpration(col))) == 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].no_capture[0] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].no_capture |= (1 << RowBitOpration(col));
                }
                // 此状态下，该列有棋子,可生成吃子着法
                else{
                    ROOK_CANNON_CAN_GET_ROW[i][j].rook_capture[0] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].rook_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            for(col ++; col < 9; col ++){
                // 已经隔了一子，判断炮是否有吃子着法
                if((j & (1 << RowBitOpration(col))) != 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].cannon_capture[0] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].cannon_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            for(col ++; col < 9; col ++){
                // 已经隔了两子，判断超级炮是否有吃子着法
                if((j & (1 << RowBitOpration(col))) != 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].supercannon_capture[0] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].supercannon_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            // 3.1.3 生成车炮左边的着法
            for(col = i - 1; col >= 0; col--){
                // 此状态下，该列没有棋子
                if((j & (1 << RowBitOpration(col))) == 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].no_capture[1] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].no_capture |= (1 << RowBitOpration(col));
                }
                // 此状态下，该列有棋子,可生成吃子着法
                else{
                    ROOK_CANNON_CAN_GET_ROW[i][j].rook_capture[1] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].rook_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            for(col --; col >= 0; col --){
                // 已经隔了一子，判断炮是否有吃子着法
                if((j & (1 << RowBitOpration(col))) != 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].cannon_capture[1] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].cannon_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            for(col --; col >= 0; col --){
                // 已经隔了两子，判断超级炮是否有吃子着法
                if((j & (1 << RowBitOpration(col))) != 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].supercannon_capture[1] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].supercannon_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
        }
    }
    // 3.2. 循环一列中的每一行
    for(int i = 0; i < 10; i ++){
        // 循环一列的每一个状态
        for(int j = 0; j < (1 << 10); j ++){
            // 3.2.1 着法初始化
            ROOK_CANNON_CAN_GET_COL[i][j].cannon_capture[0] = ROOK_CANNON_CAN_GET_COL[i][j].cannon_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_COL[i][j].no_capture[0] = ROOK_CANNON_CAN_GET_COL[i][j].no_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_COL[i][j].rook_capture[0] = ROOK_CANNON_CAN_GET_COL[i][j].rook_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_COL[i][j].supercannon_capture[0] = ROOK_CANNON_CAN_GET_COL[i][j].supercannon_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_COL_MASK[i][j].cannon_capture = ROOK_CANNON_CAN_GET_COL_MASK[i][j].supercannon_capture = ROOK_CANNON_CAN_GET_COL_MASK[i][j].no_capture = ROOK_CANNON_CAN_GET_COL_MASK[i][j].rook_capture = 0;
            // 3.2.2 生成车炮向下的着法 
            int row;
            for(row = i + 1; row < 10; row ++){
                // 当前状态下该行无棋子
                if((j & (1 << ColBitOpration(row))) == 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].no_capture[0] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].no_capture |= (1 << ColBitOpration(row));
                }
                // 当前状态下该行有棋子
                else{
                    ROOK_CANNON_CAN_GET_COL[i][j].rook_capture[0] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].rook_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            for(row ++; row < 10; row ++){
                // 隔了一子，生成炮吃法
                if((j & (1 << ColBitOpration(row))) != 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].cannon_capture[0] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].cannon_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            for(row ++; row < 10; row ++){
                // 隔了两子，生成超级炮吃法
                if((j & (1 << ColBitOpration(row))) != 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].supercannon_capture[0] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].supercannon_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            // 3.2.3 生成车炮向上的着法
            for(row = i - 1; row >= 0; row --){
                // 当前状态下该行无棋子
                if((j & (1 << ColBitOpration(row))) == 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].no_capture[1] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].no_capture |= (1 << ColBitOpration(row));
                }
                // 当前状态下该行有棋子
                else{
                    ROOK_CANNON_CAN_GET_COL[i][j].rook_capture[1] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].rook_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            for(row --; row >= 0; row --){
                // 隔了一子，生成炮吃法
                if((j & (1 << ColBitOpration(row))) != 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].cannon_capture[1] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].cannon_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            for(row --; row >= 0; row --){
                // 隔了两子，生成超级炮吃法
                if((j & (1 << ColBitOpration(row))) != 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].supercannon_capture[1] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].supercannon_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
        }
    }  
}